

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::Loop::GetInductionStepOperation(Loop *this,Instruction *induction)

{
  IRContext *pIVar1;
  CFG *pCVar2;
  DefUseManager *this_00;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t id;
  mapped_type *ppBVar5;
  size_type sVar6;
  Instruction *this_01;
  Instruction *pIVar7;
  uint uVar8;
  uint uVar9;
  uint32_t local_40;
  uint32_t local_3c;
  DefUseManager *local_38;
  
  if (induction->opcode_ != OpPhi) {
    __assert_fail("induction->opcode() == spv::Op::OpPhi",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x27,
                  "Instruction *spvtools::opt::Loop::GetInductionStepOperation(const Instruction *) const"
                 );
  }
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  local_38 = (pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar9 = (induction->has_result_id_ & 1) + 1;
  if (induction->has_type_id_ == false) {
    uVar9 = (uint)induction->has_result_id_;
  }
  if ((int)((ulong)((long)(induction->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(induction->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar9 < 2)
  {
    this_01 = (Instruction *)0x0;
  }
  else {
    uVar9 = 1;
    this_01 = (Instruction *)0x0;
    do {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar1);
      }
      uVar8 = (induction->has_result_id_ & 1) + 1;
      if (induction->has_type_id_ == false) {
        uVar8 = (uint)induction->has_result_id_;
      }
      pCVar2 = (pIVar1->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
      local_40 = Instruction::GetSingleWordOperand(induction,uVar8 + uVar9);
      ppBVar5 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&pCVar2->id2block_,&local_40);
      pIVar7 = ((*ppBVar5)->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar3 = 0;
      if (pIVar7->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      local_3c = uVar3;
      sVar6 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->loop_basic_blocks_)._M_h,&local_3c);
      if (sVar6 != 0) {
        uVar8 = (induction->has_result_id_ & 1) + 1;
        if (induction->has_type_id_ == false) {
          uVar8 = (uint)induction->has_result_id_;
        }
        uVar3 = Instruction::GetSingleWordOperand(induction,(uVar8 + uVar9) - 1);
        this_01 = analysis::DefUseManager::GetDef(local_38,uVar3);
      }
      if (sVar6 != 0) break;
      uVar9 = uVar9 + 2;
      uVar8 = (induction->has_result_id_ & 1) + 1;
      if (induction->has_type_id_ == false) {
        uVar8 = (uint)induction->has_result_id_;
      }
    } while (uVar9 < (int)((ulong)((long)(induction->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(induction->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar8);
  }
  if ((this_01 != (Instruction *)0x0) &&
     (uVar3 = 0, (this_01->opcode_ & ~OpSourceContinued) == OpIAdd)) {
    uVar4 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar4 = (uint)this_01->has_result_id_;
    }
    uVar4 = Instruction::GetSingleWordOperand(this_01,uVar4);
    uVar9 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar9 = (uint)this_01->has_result_id_;
    }
    id = Instruction::GetSingleWordOperand(this_01,uVar9 + 1);
    if (induction->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(induction,(uint)induction->has_type_id_);
    }
    if (uVar4 != uVar3) {
      uVar3 = 0;
      if (induction->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(induction,(uint)induction->has_type_id_);
      }
      if (id != uVar3) {
        return (Instruction *)0x0;
      }
    }
    this_00 = local_38;
    pIVar7 = analysis::DefUseManager::GetDef(local_38,uVar4);
    if (pIVar7->opcode_ == OpConstant) {
      return this_01;
    }
    pIVar7 = analysis::DefUseManager::GetDef(this_00,id);
    if (pIVar7->opcode_ == OpConstant) {
      return this_01;
    }
  }
  return (Instruction *)0x0;
}

Assistant:

Instruction* Loop::GetInductionStepOperation(
    const Instruction* induction) const {
  // Induction must be a phi instruction.
  assert(induction->opcode() == spv::Op::OpPhi);

  Instruction* step = nullptr;

  analysis::DefUseManager* def_use_manager = context_->get_def_use_mgr();

  // Traverse the incoming operands of the phi instruction.
  for (uint32_t operand_id = 1; operand_id < induction->NumInOperands();
       operand_id += 2) {
    // Incoming edge.
    BasicBlock* incoming_block =
        context_->cfg()->block(induction->GetSingleWordInOperand(operand_id));

    // Check if the block is dominated by header, and thus coming from within
    // the loop.
    if (IsInsideLoop(incoming_block)) {
      step = def_use_manager->GetDef(
          induction->GetSingleWordInOperand(operand_id - 1));
      break;
    }
  }

  if (!step || !IsSupportedStepOp(step->opcode())) {
    return nullptr;
  }

  // The induction variable which binds the loop must only be modified once.
  uint32_t lhs = step->GetSingleWordInOperand(0);
  uint32_t rhs = step->GetSingleWordInOperand(1);

  // One of the left hand side or right hand side of the step instruction must
  // be the induction phi and the other must be an OpConstant.
  if (lhs != induction->result_id() && rhs != induction->result_id()) {
    return nullptr;
  }

  if (def_use_manager->GetDef(lhs)->opcode() != spv::Op::OpConstant &&
      def_use_manager->GetDef(rhs)->opcode() != spv::Op::OpConstant) {
    return nullptr;
  }

  return step;
}